

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPlateType::IfcPlateType(IfcPlateType *this)

{
  IfcPlateType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcPlateType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__0105f260);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>,
             &PTR_construction_vtable_24__0105f398);
  *(undefined8 *)this = 0x105f130;
  *(undefined8 *)&this->field_0x1c0 = 0x105f248;
  *(undefined8 *)&this->field_0x88 = 0x105f158;
  *(undefined8 *)&this->field_0x98 = 0x105f180;
  *(undefined8 *)&this->field_0xf0 = 0x105f1a8;
  *(undefined8 *)&this->field_0x148 = 0x105f1d0;
  *(undefined8 *)&this->field_0x180 = 0x105f1f8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x105f220;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPlateType,_1UL>).field_0x10);
  return;
}

Assistant:

IfcPlateType() : Object("IfcPlateType") {}